

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O1

int parse_DA_values(char *inArg,uint *DA_x0,uint *DA_y0,uint *DA_x1,uint *DA_y1)

{
  ulong uVar1;
  uint uVar2;
  char *__nptr;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  int values [4];
  uint local_48 [4];
  uint *local_38;
  
  __nptr = strtok(inArg,",");
  iVar4 = 1;
  if (__nptr != (char *)0x0) {
    uVar3 = 0;
    local_38 = DA_y1;
    do {
      uVar2 = atoi(__nptr);
      local_48[uVar3] = uVar2;
      __nptr = strtok((char *)0x0,",");
      uVar1 = uVar3 + 1;
      if (__nptr == (char *)0x0) break;
      bVar5 = uVar3 < 3;
      uVar3 = uVar1;
    } while (bVar5);
    if (uVar1 == 4) {
      *DA_x0 = local_48[0];
      *DA_y0 = local_48[1];
      *DA_x1 = local_48[2];
      *local_38 = local_48[3];
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int parse_DA_values(char* inArg, unsigned int *DA_x0, unsigned int *DA_y0,
                    unsigned int *DA_x1, unsigned int *DA_y1)
{
    int it = 0;
    int values[4];
    char delims[] = ",";
    char *result = NULL;
    result = strtok(inArg, delims);

    while ((result != NULL) && (it < 4)) {
        values[it] = atoi(result);
        result = strtok(NULL, delims);
        it++;
    }

    if (it != 4) {
        return EXIT_FAILURE;
    } else {
        *DA_x0 = (OPJ_UINT32)values[0];
        *DA_y0 = (OPJ_UINT32)values[1];
        *DA_x1 = (OPJ_UINT32)values[2];
        *DA_y1 = (OPJ_UINT32)values[3];
        return EXIT_SUCCESS;
    }
}